

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::iterate(ThreadCleanUpTest *this)

{
  EGLDisplay pvVar1;
  EGLConfig pvVar2;
  EGLSurface pvVar3;
  EGLContext pvVar4;
  char *__s;
  Library *pLVar5;
  size_t sVar6;
  IterateResult IVar7;
  Maybe<eglu::Error> error;
  Thread thread;
  undefined8 *local_238 [8];
  Thread local_1f8;
  Library *local_1e0;
  EGLDisplay local_1d8;
  EGLSurface local_1d0;
  EGLContext local_1c8;
  EGLConfig local_1c0;
  undefined1 *local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  if (this->m_iterNdx < this->m_iterCount) {
    local_238[0] = (undefined8 *)0x0;
    pLVar5 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    pvVar1 = this->m_display;
    pvVar2 = this->m_config;
    pvVar3 = this->m_surface;
    pvVar4 = this->m_context;
    de::Thread::Thread(&local_1f8);
    local_1f8._vptr_Thread = (_func_int **)&PTR__Thread_02156b80;
    local_1e0 = pLVar5;
    local_1d8 = pvVar1;
    local_1d0 = pvVar3;
    local_1c8 = pvVar4;
    local_1c0 = pvVar2;
    local_1b8 = (undefined1 *)local_238;
    de::Thread::start(&local_1f8);
    de::Thread::join(&local_1f8);
    if (local_238[0] == (undefined8 *)0x0) {
      this->m_iterNdx = this->m_iterNdx + 1;
      IVar7 = CONTINUE;
    }
    else {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Failed. Got error: ",0x13);
      __s = (char *)local_238[0][2];
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
      }
      else {
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar6);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      IVar7 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 (char *)local_238[0][2]);
    }
    de::Thread::~Thread(&local_1f8);
    if (local_238[0] != (undefined8 *)0x0) {
      (**(code **)*local_238[0])();
    }
  }
  else {
    IVar7 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return IVar7;
}

Assistant:

IterateResult iterate (void)
	{
		if (m_iterNdx < m_iterCount)
		{
			tcu::Maybe<eglu::Error> error;

			Thread thread (m_eglTestCtx.getLibrary(), m_display, m_surface, m_context, m_config, error);

			thread.start();
			thread.join();

			if (error)
			{
				m_testCtx.getLog() << TestLog::Message << "Failed. Got error: " << error->getMessage() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, error->getMessage());
				return STOP;
			}

			m_iterNdx++;
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}